

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.cpp
# Opt level: O3

Ref<embree::SceneGraph::Node> __thiscall embree::HeightField::geometry(HeightField *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  size_t sVar3;
  pointer pvVar4;
  Vec3fa *ptr;
  pointer pTVar5;
  undefined8 uVar6;
  Node *pNVar7;
  OBJMaterial *this_00;
  TriangleMeshNode *this_01;
  Vec3fa *pVVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  size_t y;
  ulong uVar12;
  ulong uVar13;
  size_t in_RSI;
  long lVar14;
  int iVar15;
  vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
  *this_02;
  ulong uVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  Ref<embree::SceneGraph::MaterialNode> local_98;
  size_t local_90;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_88;
  Node *local_78;
  long local_70;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_68;
  char local_58 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_48;
  
  local_90 = in_RSI;
  this_00 = (OBJMaterial *)alignedUSMMalloc(0x180,0x10,DEVICE_READ_ONLY);
  local_88._0_8_ = 0x3f8000003f800000;
  local_88._8_8_ = 0x3f8000003f800000;
  local_48._0_8_ = 0;
  local_48._8_8_ = 0;
  local_68._0_8_ = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"");
  OBJMaterial::OBJMaterial
            (this_00,1.0,(Vec3fa *)&local_88.field_1,(Vec3fa *)&local_48.field_1,1.0,
             (string *)&local_68.field_1);
  (*(this_00->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[2])(this_00);
  if ((char *)local_68._0_8_ != local_58) {
    operator_delete((void *)local_68._0_8_);
  }
  this_01 = (TriangleMeshNode *)operator_new(0xd8);
  local_98.ptr = (MaterialNode *)this_00;
  (*(this_00->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[2])();
  SceneGraph::TriangleMeshNode::TriangleMeshNode(this_01,&local_98,(BBox1f)0x3f8000003f800000,0);
  (*(this_01->super_Node).super_RefCount._vptr_RefCount[2])(this_01);
  if ((OBJMaterial *)local_98.ptr != (OBJMaterial *)0x0) {
    (*(((Node *)&((local_98.ptr)->super_Node).super_RefCount)->super_RefCount)._vptr_RefCount[3])();
  }
  sVar3 = *(size_t *)(*(long *)(local_90 + 0x10) + 0x10);
  lVar10 = *(long *)(*(long *)(local_90 + 0x10) + 0x18);
  pvVar4 = (this_01->positions).
           super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar16 = lVar10 * sVar3;
  uVar9 = pvVar4->size_alloced;
  uVar13 = uVar9;
  if ((uVar9 < uVar16) && (uVar13 = uVar16, uVar12 = uVar9, uVar9 != 0)) {
    do {
      uVar13 = uVar12 * 2 + (ulong)(uVar12 * 2 == 0);
      uVar12 = uVar13;
    } while (uVar13 < uVar16);
  }
  if (uVar16 < pvVar4->size_active) {
    pvVar4->size_active = uVar16;
  }
  local_78 = (Node *)this;
  if (uVar9 == uVar13) {
    pvVar4->size_active = uVar16;
  }
  else {
    ptr = pvVar4->items;
    pVVar8 = (Vec3fa *)alignedMalloc(uVar13 << 4,0x10);
    pvVar4->items = pVVar8;
    if (pvVar4->size_active != 0) {
      lVar18 = 0;
      uVar9 = 0;
      do {
        puVar1 = (undefined8 *)((long)&ptr->field_0 + lVar18);
        uVar6 = puVar1[1];
        puVar2 = (undefined8 *)((long)&pvVar4->items->field_0 + lVar18);
        *puVar2 = *puVar1;
        puVar2[1] = uVar6;
        uVar9 = uVar9 + 1;
        lVar18 = lVar18 + 0x10;
      } while (uVar9 < pvVar4->size_active);
    }
    alignedFree(ptr);
    pvVar4->size_active = uVar16;
    pvVar4->size_alloced = uVar13;
  }
  if (lVar10 != 0) {
    local_70 = sVar3 << 4;
    lVar19 = 0;
    lVar18 = 0;
    do {
      if (sVar3 != 0) {
        y = 0;
        lVar17 = lVar19;
        do {
          at((HeightField *)&local_88.field_1,local_90,y);
          puVar1 = (undefined8 *)
                   ((long)&((this_01->positions).
                            super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->items->field_0 + lVar17);
          *puVar1 = local_88._0_8_;
          puVar1[1] = local_88._8_8_;
          y = y + 1;
          lVar17 = lVar17 + 0x10;
        } while (sVar3 != y);
      }
      lVar18 = lVar18 + 1;
      lVar19 = lVar19 + local_70;
    } while (lVar18 != lVar10);
  }
  this_02 = &this_01->triangles;
  lVar10 = lVar10 + -1;
  lVar18 = sVar3 - 1;
  std::
  vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
  ::resize(this_02,lVar18 * lVar10 * 2);
  pNVar7 = local_78;
  if (lVar10 != 0) {
    lVar19 = 0;
    do {
      if (lVar18 != 0) {
        iVar11 = (int)lVar19 * (int)sVar3;
        lVar14 = lVar18 * 0x18 * lVar19;
        lVar17 = lVar18;
        iVar15 = ((int)lVar19 + 1) * (int)sVar3;
        do {
          pTVar5 = (this_02->
                   super__Vector_base<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          *(int *)((long)&pTVar5->v0 + lVar14) = iVar11;
          iVar11 = iVar11 + 1;
          *(int *)((long)&pTVar5->v1 + lVar14) = iVar11;
          *(int *)((long)&pTVar5->v2 + lVar14) = iVar15;
          pTVar5 = (this_02->
                   super__Vector_base<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          *(int *)((long)&pTVar5[1].v0 + lVar14) = iVar11;
          *(int *)((long)&pTVar5[1].v1 + lVar14) = iVar15 + 1;
          *(int *)((long)&pTVar5[1].v2 + lVar14) = iVar15;
          lVar14 = lVar14 + 0x18;
          lVar17 = lVar17 + -1;
          iVar15 = iVar15 + 1;
        } while (lVar17 != 0);
      }
      lVar19 = lVar19 + 1;
    } while (lVar19 != lVar10);
  }
  (local_78->super_RefCount)._vptr_RefCount = (_func_int **)this_01;
  (*(this_01->super_Node).super_RefCount._vptr_RefCount[2])(this_01);
  (*(this_01->super_Node).super_RefCount._vptr_RefCount[3])(this_01);
  (*(this_00->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[3])();
  return (Ref<embree::SceneGraph::Node>)pNVar7;
}

Assistant:

Ref<SceneGraph::Node> geometry()
    {
      Ref<SceneGraph::MaterialNode> mnode = new OBJMaterial(1.0f,Vec3fa(1.0f),Vec3fa(0.0f),1.0f);
      Ref<SceneGraph::TriangleMeshNode> mesh = new SceneGraph::TriangleMeshNode(mnode,1);

      const size_t width = texture->width;
      const size_t height = texture->height;
      
      mesh->positions[0].resize(height*width);
      for (size_t y=0; y<height; y++) 
        for (size_t x=0; x<width; x++) 
          mesh->positions[0][y*width+x] = at(x,y);

      mesh->triangles.resize(2*(height-1)*(width-1));
      for (size_t y=0; y<height-1; y++) {
        for (size_t x=0; x<width-1; x++) {
          const size_t p00 = (y+0)*width+(x+0);
          const size_t p01 = (y+0)*width+(x+1);
          const size_t p10 = (y+1)*width+(x+0);
          const size_t p11 = (y+1)*width+(x+1);
          const size_t tri = y*(width-1)+x;
          mesh->triangles[2*tri+0] = SceneGraph::TriangleMeshNode::Triangle(unsigned(p00),unsigned(p01),unsigned(p10));
          mesh->triangles[2*tri+1] = SceneGraph::TriangleMeshNode::Triangle(unsigned(p01),unsigned(p11),unsigned(p10));
        }
      }
      return mesh.dynamicCast<SceneGraph::Node>();
    }